

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  gzFile pgVar5;
  FILE *in;
  char **ppcVar6;
  bool bVar7;
  char *__s1;
  bool bVar8;
  char outmode [20];
  undefined4 local_48;
  undefined1 local_44;
  
  local_44 = 0;
  local_48 = 0x20366277;
  pcVar1 = *argv;
  prog = pcVar1;
  pcVar4 = strrchr(pcVar1,0x2f);
  __s1 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    __s1 = pcVar1;
  }
  iVar2 = strcmp(__s1,"gunzip");
  if (iVar2 == 0) {
    bVar8 = true;
    bVar7 = false;
  }
  else {
    iVar2 = strcmp(__s1,"zcat");
    bVar8 = iVar2 == 0;
    bVar7 = bVar8;
  }
  ppcVar6 = argv + 1;
  iVar2 = argc + -1;
  if (1 < argc) {
    do {
      pcVar1 = *ppcVar6;
      iVar3 = strcmp(pcVar1,"-c");
      if (iVar3 == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = strcmp(pcVar1,"-d");
        if (iVar3 == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = strcmp(pcVar1,"-f");
          if (iVar3 == 0) {
            local_48 = CONCAT13(0x66,(undefined3)local_48);
          }
          else {
            iVar3 = strcmp(pcVar1,"-h");
            if (iVar3 == 0) {
              local_48 = CONCAT13(0x68,(undefined3)local_48);
            }
            else {
              iVar3 = strcmp(pcVar1,"-r");
              if (iVar3 == 0) {
                local_48 = CONCAT13(0x52,(undefined3)local_48);
              }
              else {
                if (*pcVar1 != '-') {
                  iVar2 = argc + -1;
                  goto LAB_0010195d;
                }
                if ((8 < (byte)(pcVar1[1] - 0x31U)) || (pcVar1[2] != '\0')) goto LAB_0010195d;
                local_48._0_3_ = CONCAT12(pcVar1[1],(undefined2)local_48);
              }
            }
          }
        }
      }
      ppcVar6 = ppcVar6 + 1;
      iVar2 = iVar2 + -1;
      argc = argc + -1;
    } while (1 < argc);
    iVar2 = 0;
  }
LAB_0010195d:
  if (local_48._3_1_ == ' ') {
    local_48 = local_48 & 0xffffff;
  }
  if (iVar2 == 0) {
    if (bVar8) {
      iVar2 = fileno(_stdin);
      pgVar5 = (gzFile)gzdopen(iVar2,"rb");
      if (pgVar5 == (gzFile)0x0) {
LAB_00101abc:
        main_cold_3();
LAB_00101ac1:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar5,(FILE *)_stdout);
    }
    else {
      iVar2 = fileno(_stdout);
      pgVar5 = (gzFile)gzdopen(iVar2,&local_48);
      if (pgVar5 == (gzFile)0x0) goto LAB_00101ac1;
      gz_compress((FILE *)_stdin,pgVar5);
    }
  }
  else {
    do {
      pcVar1 = *ppcVar6;
      if (bVar8) {
        if (bVar7) {
          pgVar5 = (gzFile)gzopen(pcVar1,"rb");
          if (pgVar5 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar5,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar1);
        }
      }
      else if (bVar7) {
        in = fopen(pcVar1,"rb");
        if (in == (FILE *)0x0) {
          perror(*ppcVar6);
        }
        else {
          iVar3 = fileno(_stdout);
          pgVar5 = (gzFile)gzdopen(iVar3,&local_48);
          if (pgVar5 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101abc;
          }
          gz_compress((FILE *)in,pgVar5);
        }
      }
      else {
        file_compress(pcVar1,(char *)&local_48);
      }
      ppcVar6 = ppcVar6 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    int copyout = 0;
    int uncompr = 0;
    gzFile file;
    char *bname, outmode[20];

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outmode, sizeof(outmode), "%s", "wb6 ");
#else
    strcpy(outmode, "wb6 ");
#endif

    prog = argv[0];
    bname = strrchr(argv[0], '/');
    if (bname)
      bname++;
    else
      bname = argv[0];
    argc--, argv++;

    if (!strcmp(bname, "gunzip"))
      uncompr = 1;
    else if (!strcmp(bname, "zcat"))
      copyout = uncompr = 1;

    while (argc > 0) {
      if (strcmp(*argv, "-c") == 0)
        copyout = 1;
      else if (strcmp(*argv, "-d") == 0)
        uncompr = 1;
      else if (strcmp(*argv, "-f") == 0)
        outmode[3] = 'f';
      else if (strcmp(*argv, "-h") == 0)
        outmode[3] = 'h';
      else if (strcmp(*argv, "-r") == 0)
        outmode[3] = 'R';
      else if ((*argv)[0] == '-' && (*argv)[1] >= '1' && (*argv)[1] <= '9' &&
               (*argv)[2] == 0)
        outmode[2] = (*argv)[1];
      else
        break;
      argc--, argv++;
    }
    if (outmode[3] == ' ')
        outmode[3] = 0;
    if (argc == 0) {
        SET_BINARY_MODE(stdin);
        SET_BINARY_MODE(stdout);
        if (uncompr) {
            file = gzdopen(fileno(stdin), "rb");
            if (file == NULL) error("can't gzdopen stdin");
            gz_uncompress(file, stdout);
        } else {
            file = gzdopen(fileno(stdout), outmode);
            if (file == NULL) error("can't gzdopen stdout");
            gz_compress(stdin, file);
        }
    } else {
        if (copyout) {
            SET_BINARY_MODE(stdout);
        }
        do {
            if (uncompr) {
                if (copyout) {
                    file = gzopen(*argv, "rb");
                    if (file == NULL)
                        fprintf(stderr, "%s: can't gzopen %s\n", prog, *argv);
                    else
                        gz_uncompress(file, stdout);
                } else {
                    file_uncompress(*argv);
                }
            } else {
                if (copyout) {
                    FILE * in = fopen(*argv, "rb");

                    if (in == NULL) {
                        perror(*argv);
                    } else {
                        file = gzdopen(fileno(stdout), outmode);
                        if (file == NULL) error("can't gzdopen stdout");

                        gz_compress(in, file);
                    }

                } else {
                    file_compress(*argv, outmode);
                }
            }
        } while (argv++, --argc);
    }
    return 0;
}